

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obstacle.h
# Opt level: O1

void __thiscall
Obstacle::Obstacle(Obstacle *this,int x,int y,int limit,int speed,string *axis,
                  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *cars)

{
  pointer pcVar1;
  
  this->_xpos = x;
  this->_ypos = y;
  this->_collision_distance = 10;
  this->_delay = 0x19;
  this->_active = true;
  this->_speed = speed;
  this->_limit = limit;
  (this->_axis)._M_dataplus._M_p = (pointer)&(this->_axis).field_2;
  pcVar1 = (axis->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_axis,pcVar1,pcVar1 + axis->_M_string_length);
  std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
            (&this->_cars,cars);
  return;
}

Assistant:

Obstacle(int x, int y,int limit, int speed, std::string axis, std::vector<std::shared_ptr<Car>> cars):_xpos(x), _ypos(y), _limit(limit), _speed(speed), _axis(axis), _cars(cars){
        //std::cout <<"creating obstacle";
    }